

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int clearCellOverflow(MemPage *pPage,uchar *pCell,CellInfo *pInfo)

{
  BtShared *pBt;
  int iVar1;
  u32 ovfl;
  uint uVar2;
  ulong uVar3;
  MemPage *pMemPage;
  Pgno iNext;
  MemPage *pOvfl;
  Pgno local_3c;
  MemPage *local_38;
  
  if (pPage->aDataEnd < pCell + pInfo->nSize) {
    iVar1 = sqlite3CorruptError(0x1242c);
    return iVar1;
  }
  ovfl = sqlite3Get4byte(pCell + pInfo->nSize + -4);
  pBt = pPage->pBt;
  uVar2 = pBt->usableSize - 4;
  uVar3 = (ulong)(~(uint)pInfo->nLocal + pInfo->nPayload + uVar2) / (ulong)uVar2;
  do {
    iVar1 = (int)uVar3;
    uVar2 = iVar1 - 1;
    uVar3 = (ulong)uVar2;
    if (iVar1 == 0) {
      return 0;
    }
    local_3c = 0;
    local_38 = (MemPage *)0x0;
    if ((ovfl < 2) || (pBt->nPage < ovfl)) {
      iVar1 = sqlite3CorruptError(0x1243d);
      return iVar1;
    }
    if (uVar2 == 0) {
LAB_00172d46:
      local_38 = btreePageLookup(pBt,ovfl);
      if (local_38 != (MemPage *)0x0) goto LAB_00172d5e;
      pMemPage = (MemPage *)0x0;
LAB_00172d77:
      iVar1 = freePage2(pBt,pMemPage,ovfl);
    }
    else {
      iVar1 = getOverflowPage(pBt,ovfl,&local_38,&local_3c);
      if (iVar1 != 0) {
        return iVar1;
      }
      if (local_38 == (MemPage *)0x0) goto LAB_00172d46;
LAB_00172d5e:
      pMemPage = local_38;
      if (local_38->pDbPage->nRef == 1) goto LAB_00172d77;
      iVar1 = sqlite3CorruptError(0x12451);
    }
    if (local_38 != (MemPage *)0x0) {
      sqlite3PagerUnref(local_38->pDbPage);
    }
    ovfl = local_3c;
    if (iVar1 != 0) {
      return iVar1;
    }
  } while( true );
}

Assistant:

static SQLITE_NOINLINE int clearCellOverflow(
  MemPage *pPage,          /* The page that contains the Cell */
  unsigned char *pCell,    /* First byte of the Cell */
  CellInfo *pInfo          /* Size information about the cell */
){
  BtShared *pBt;
  Pgno ovflPgno;
  int rc;
  int nOvfl;
  u32 ovflPageSize;

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pInfo->nLocal!=pInfo->nPayload );
  testcase( pCell + pInfo->nSize == pPage->aDataEnd );
  testcase( pCell + (pInfo->nSize-1) == pPage->aDataEnd );
  if( pCell + pInfo->nSize > pPage->aDataEnd ){
    /* Cell extends past end of page */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  ovflPgno = get4byte(pCell + pInfo->nSize - 4);
  pBt = pPage->pBt;
  assert( pBt->usableSize > 4 );
  ovflPageSize = pBt->usableSize - 4;
  nOvfl = (pInfo->nPayload - pInfo->nLocal + ovflPageSize - 1)/ovflPageSize;
  assert( nOvfl>0 ||
    (CORRUPT_DB && (pInfo->nPayload + ovflPageSize)<ovflPageSize)
  );
  while( nOvfl-- ){
    Pgno iNext = 0;
    MemPage *pOvfl = 0;
    if( ovflPgno<2 || ovflPgno>btreePagecount(pBt) ){
      /* 0 is not a legal page number and page 1 cannot be an
      ** overflow page. Therefore if ovflPgno<2 or past the end of the
      ** file the database must be corrupt. */
      return SQLITE_CORRUPT_BKPT;
    }
    if( nOvfl ){
      rc = getOverflowPage(pBt, ovflPgno, &pOvfl, &iNext);
      if( rc ) return rc;
    }

    if( ( pOvfl || ((pOvfl = btreePageLookup(pBt, ovflPgno))!=0) )
     && sqlite3PagerPageRefcount(pOvfl->pDbPage)!=1
    ){
      /* There is no reason any cursor should have an outstanding reference
      ** to an overflow page belonging to a cell that is being deleted/updated.
      ** So if there exists more than one reference to this page, then it
      ** must not really be an overflow page and the database must be corrupt.
      ** It is helpful to detect this before calling freePage2(), as
      ** freePage2() may zero the page contents if secure-delete mode is
      ** enabled. If this 'overflow' page happens to be a page that the
      ** caller is iterating through or using in some other way, this
      ** can be problematic.
      */
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = freePage2(pBt, pOvfl, ovflPgno);
    }

    if( pOvfl ){
      sqlite3PagerUnref(pOvfl->pDbPage);
    }
    if( rc ) return rc;
    ovflPgno = iNext;
  }
  return SQLITE_OK;
}